

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9HashmapCmp(jx9_hashmap *pLeft,jx9_hashmap *pRight,int bStrict)

{
  SyBlob *pKey;
  sxu32 n;
  sxi32 rc;
  jx9_hashmap_node *pRe;
  jx9_hashmap_node *pLe;
  jx9_hashmap *pjStack_20;
  int bStrict_local;
  jx9_hashmap *pRight_local;
  jx9_hashmap *pLeft_local;
  
  if (pLeft == pRight) {
    pLeft_local._4_4_ = 0;
  }
  else if (pLeft->nEntry == pRight->nEntry) {
    pRe = pLeft->pFirst;
    _n = (jx9_hashmap_node *)0x0;
    pLe._4_4_ = bStrict;
    pjStack_20 = pRight;
    pRight_local = pLeft;
    for (pKey._0_4_ = pLeft->nEntry; (sxu32)pKey != 0; pKey._0_4_ = (sxu32)pKey - 1) {
      if (pRe->iType == 1) {
        pKey._4_4_ = HashmapLookupIntKey(pjStack_20,(pRe->xKey).iKey,(jx9_hashmap_node **)&n);
      }
      else {
        pKey._4_4_ = HashmapLookupBlobKey
                               (pjStack_20,(pRe->xKey).sKey.pBlob,(pRe->xKey).sKey.nByte,
                                (jx9_hashmap_node **)&n);
      }
      if (pKey._4_4_ != 0) {
        return 1;
      }
      pKey._4_4_ = 0;
      if (pLe._4_4_ != 0) {
        pKey._4_4_ = (uint)(pRe->iType != _n->iType);
      }
      if (pKey._4_4_ == 0) {
        pKey._4_4_ = HashmapNodeCmp(pRe,_n,pLe._4_4_);
      }
      if (pKey._4_4_ != 0) {
        return pKey._4_4_;
      }
      pRe = pRe->pPrev;
    }
    pLeft_local._4_4_ = 0;
  }
  else {
    pLeft_local._4_4_ = -1;
    if (pRight->nEntry < pLeft->nEntry) {
      pLeft_local._4_4_ = 1;
    }
  }
  return pLeft_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 jx9HashmapCmp(
	jx9_hashmap *pLeft,  /* Left hashmap */
	jx9_hashmap *pRight, /* Right hashmap */
	int bStrict          /* TRUE for strict comparison */
	)
{
	jx9_hashmap_node *pLe, *pRe;
	sxi32 rc;
	sxu32 n;
	if( pLeft == pRight ){
		/* Same hashmap instance. This can easily happen since hashmaps are passed by reference.
		 * Unlike the  engine.
		 */
		return 0;
	}
	if( pLeft->nEntry != pRight->nEntry ){
		/* Must have the same number of entries */
		return pLeft->nEntry > pRight->nEntry ? 1 : -1;
	}
	/* Point to the first inserted entry of the left hashmap */
	pLe = pLeft->pFirst;
	pRe = 0; /* cc warning */
	/* Perform the comparison */
	n = pLeft->nEntry;
	for(;;){
		if( n < 1 ){
			break;
		}
		if( pLe->iType == HASHMAP_INT_NODE){
			/* Int key */
			rc = HashmapLookupIntKey(&(*pRight), pLe->xKey.iKey, &pRe);
		}else{
			SyBlob *pKey = &pLe->xKey.sKey;
			/* Blob key */
			rc = HashmapLookupBlobKey(&(*pRight), SyBlobData(pKey), SyBlobLength(pKey), &pRe);
		}
		if( rc != SXRET_OK ){
			/* No such entry in the right side */
			return 1;
		}
		rc = 0;
		if( bStrict ){
			/* Make sure, the keys are of the same type */
			if( pLe->iType != pRe->iType ){
				rc = 1;
			}
		}
		if( !rc ){
			/* Compare nodes */
			rc = HashmapNodeCmp(pLe, pRe, bStrict);
		}
		if( rc != 0 ){
			/* Nodes key/value differ */
			return rc;
		}
		/* Point to the next entry */
		pLe = pLe->pPrev; /* Reverse link */
		n--;
	}
	return 0; /* Hashmaps are equals */
}